

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_bigfloat(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this
             ,string_type *str,error_code *ec)

{
  bool bVar1;
  cbor_major_type cVar2;
  uint8_t uVar3;
  char_result<unsigned_char> cVar4;
  char_result<unsigned_char> cVar5;
  size_t sVar6;
  basic_bigint<std::allocator<unsigned_char>_> *this_00;
  ssize_t sVar7;
  basic_bigint<std::allocator<unsigned_char>_> *pbVar8;
  undefined8 in_RCX;
  undefined8 uVar9;
  error_code *in_RDX;
  ulong in_RSI;
  char cVar10;
  long in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  basic_bigint<std::allocator<unsigned_char>_> *y;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000028;
  unsigned_long in_stack_00000030;
  bigint n_1;
  bigint n;
  uint8_t tag;
  uint8_t b;
  int64_t val_1;
  uint64_t val;
  int64_t exponent;
  char_result<unsigned_char> c;
  size_t size;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_fffffffffffffec0;
  stream_source<unsigned_char> *in_stack_fffffffffffffec8;
  error_code *in_stack_fffffffffffffed0;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_fffffffffffffed8;
  error_code *in_stack_fffffffffffffee0;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_fffffffffffffee8;
  error_code *in_stack_ffffffffffffff10;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_ffffffffffffff18;
  error_code *in_stack_ffffffffffffff70;
  byte_string_type *in_stack_ffffffffffffff78;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  uint8_t local_49;
  int64_t local_48;
  uint64_t local_40;
  undefined6 in_stack_ffffffffffffffc8;
  uint8_t local_22;
  
  sVar6 = get_size(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
  if (!bVar1) {
    if (sVar6 == 2) {
      cVar4 = stream_source<unsigned_char>::peek(in_stack_fffffffffffffec8);
      if (((ushort)cVar4 & 0x100) == 0) {
        local_22 = cVar4.value;
        cVar2 = get_major_type(local_22);
        uVar9 = CONCAT71((int7)((ulong)in_RCX >> 8),cVar2);
        if (cVar2 == unsigned_integer) {
          this_00 = (basic_bigint<std::allocator<unsigned_char>_> *)
                    get_uint64_value(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
          bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
          if (bVar1) {
            return;
          }
        }
        else {
          if (cVar2 != negative_integer) {
            std::error_code::operator=
                      (in_stack_fffffffffffffed0,
                       (cbor_errc)((ulong)in_stack_fffffffffffffec8 >> 0x20));
            *(undefined1 *)(in_RDI + 8) = 0;
            return;
          }
          this_00 = (basic_bigint<std::allocator<unsigned_char>_> *)
                    get_int64_value(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
          bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
          if (bVar1) {
            return;
          }
        }
        cVar4 = stream_source<unsigned_char>::peek(in_stack_fffffffffffffec8);
        if (((ushort)cVar4 & 0x100) == 0) {
          local_22 = cVar4.value;
          cVar2 = get_major_type(local_22);
          cVar10 = (char)in_RSI;
          if (cVar2 == unsigned_integer) {
            local_40 = get_uint64_value(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
            bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
            if (bVar1) {
              return;
            }
            std::__cxx11::string::push_back(cVar10);
            std::__cxx11::string::push_back(cVar10);
            jsoncons::detail::integer_to_hex<unsigned_long,std::__cxx11::string>
                      (in_stack_00000030,in_stack_00000028);
          }
          else if (cVar2 == negative_integer) {
            local_48 = get_int64_value(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
            bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
            if (bVar1) {
              return;
            }
            std::__cxx11::string::push_back(cVar10);
            std::__cxx11::string::push_back(cVar10);
            std::__cxx11::string::push_back(cVar10);
            jsoncons::detail::integer_to_hex<unsigned_long,std::__cxx11::string>
                      (in_stack_00000030,in_stack_00000028);
          }
          else {
            if (cVar2 != semantic_tag) {
              std::error_code::operator=
                        (in_stack_fffffffffffffed0,
                         (cbor_errc)((ulong)in_stack_fffffffffffffec8 >> 0x20));
              *(undefined1 *)(in_RDI + 8) = 0;
              return;
            }
            sVar7 = stream_source<unsigned_char>::read
                              ((stream_source<unsigned_char> *)(in_RDI + 0x30),(int)&local_49,
                               (void *)0x1,CONCAT71((int7)((ulong)uVar9 >> 8),cVar2));
            if (sVar7 == 0) {
              std::error_code::operator=
                        (in_stack_fffffffffffffed0,
                         (cbor_errc)((ulong)in_stack_fffffffffffffec8 >> 0x20));
              *(undefined1 *)(in_RDI + 8) = 0;
              return;
            }
            uVar3 = get_additional_information_value(local_49);
            cVar5 = stream_source<unsigned_char>::peek(in_stack_fffffffffffffec8);
            if (((ushort)cVar5 & 0x100) != 0) {
              std::error_code::operator=
                        (in_stack_fffffffffffffed0,
                         (cbor_errc)((ulong)in_stack_fffffffffffffec8 >> 0x20));
              *(undefined1 *)(in_RDI + 8) = 0;
              return;
            }
            local_22 = cVar5.value;
            cVar2 = get_major_type(local_22);
            if (cVar2 == byte_string) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2e5ffd);
              read_byte_string(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                               in_stack_ffffffffffffff70);
              bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
              if (bVar1) {
                *(undefined1 *)(in_RDI + 8) = 0;
                return;
              }
              if (uVar3 == '\x02') {
                std::__cxx11::string::push_back(cVar10);
                std::__cxx11::string::push_back(cVar10);
                this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x200);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2e6089);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_01);
                basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                          (in_stack_ffffffffffffff8c,(uint8_t *)in_stack_ffffffffffffff80,
                           (size_t)in_stack_ffffffffffffff78);
                basic_bigint<std::allocator<unsigned_char>>::
                write_string_hex<char,std::char_traits<char>,std::allocator<char>>
                          (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT26(cVar4,in_stack_ffffffffffffffc8));
                basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                          (in_stack_fffffffffffffec0);
              }
              else if (uVar3 == '\x03') {
                std::__cxx11::string::push_back(cVar10);
                std::__cxx11::string::push_back(cVar10);
                y = (basic_bigint<std::allocator<unsigned_char>_> *)(in_RDI + 0x200);
                pbVar8 = (basic_bigint<std::allocator<unsigned_char>_> *)
                         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    0x2e614e);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)y);
                basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                          (in_stack_ffffffffffffff8c,(uint8_t *)in_stack_ffffffffffffff80,
                           (size_t)in_stack_ffffffffffffff78);
                basic_bigint<std::allocator<unsigned_char>_>::basic_bigint<int>
                          ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffee0
                           ,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),pbVar8);
                jsoncons::operator-((basic_bigint<std::allocator<unsigned_char>_> *)
                                    in_stack_fffffffffffffed8,pbVar8);
                basic_bigint<std::allocator<unsigned_char>_>::operator=(pbVar8,y);
                basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                          (in_stack_fffffffffffffec0);
                basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                          (in_stack_fffffffffffffec0);
                basic_bigint<std::allocator<unsigned_char>>::
                write_string_hex<char,std::char_traits<char>,std::allocator<char>>
                          (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT26(cVar4,in_stack_ffffffffffffffc8));
                pbVar8 = (basic_bigint<std::allocator<unsigned_char>_> *)
                         std::__cxx11::string::operator[](in_RSI);
                *(undefined1 *)pbVar8 = 0x78;
                basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint(pbVar8);
              }
            }
          }
          std::__cxx11::string::push_back(cVar10);
          if ((long)this_00 < 0) {
            std::__cxx11::string::push_back(cVar10);
            jsoncons::detail::integer_to_hex<unsigned_long,std::__cxx11::string>
                      (in_stack_00000030,in_stack_00000028);
          }
          else {
            jsoncons::detail::integer_to_hex<unsigned_long,std::__cxx11::string>
                      (in_stack_00000030,in_stack_00000028);
          }
        }
        else {
          std::error_code::operator=
                    (in_stack_fffffffffffffed0,(cbor_errc)((ulong)in_stack_fffffffffffffec8 >> 0x20)
                    );
          *(undefined1 *)(in_RDI + 8) = 0;
        }
      }
      else {
        std::error_code::operator=
                  (in_stack_fffffffffffffed0,(cbor_errc)((ulong)in_stack_fffffffffffffec8 >> 0x20));
        *(undefined1 *)(in_RDI + 8) = 0;
      }
    }
    else {
      std::error_code::operator=
                (in_stack_fffffffffffffed0,(cbor_errc)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      *(undefined1 *)(in_RDI + 8) = 0;
    }
  }
  return;
}

Assistant:

void read_bigfloat(string_type& str, std::error_code& ec)
    {
        std::size_t size = get_size(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        if (size != 2)
        {
            ec = cbor_errc::invalid_bigfloat;
            more_ = false;
            return;
        }

        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        int64_t exponent = 0;
        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                exponent = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                exponent = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_bigfloat;
                more_ = false;
                return;
            }
        }

        c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                uint64_t val = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                str.push_back('0');
                str.push_back('x');
                jsoncons::detail::integer_to_hex(val, str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                int64_t val = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                str.push_back('-');
                str.push_back('0');
                str.push_back('x');
                jsoncons::detail::integer_to_hex(static_cast<uint64_t>(-val), str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::semantic_tag:
            {
                uint8_t b;
                if (source_.read(&b, 1) == 0)
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                uint8_t tag = get_additional_information_value(b);

                c = source_.peek();
                if (JSONCONS_UNLIKELY(c.eof))
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                if (get_major_type(c.value) == jsoncons::cbor::detail::cbor_major_type::byte_string)
                {
                    bytes_buffer_.clear(); 
                    read_byte_string(bytes_buffer_, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    if (tag == 2)
                    {
                        str.push_back('0');
                        str.push_back('x');
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n.write_string_hex(str);
                    }
                    else if (tag == 3)
                    {
                        str.push_back('-');
                        str.push_back('0');
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n = -1 - n;
                        n.write_string_hex(str);
                        str[2] = 'x'; // overwrite minus
                    }
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_bigfloat;
                more_ = false;
                return;
            }
        }

        str.push_back('p');
        if (exponent >=0)
        {
            jsoncons::detail::integer_to_hex(static_cast<uint64_t>(exponent), str);
        }
        else
        {
            str.push_back('-');
            jsoncons::detail::integer_to_hex(static_cast<uint64_t>(-exponent), str);
        }
    }